

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::v5::file::dup(file *this,int __fd)

{
  int error_code;
  system_error *this_00;
  int *piVar1;
  string_view local_28;
  int local_18;
  int local_14;
  int new_fd;
  int fd_local;
  
  local_14 = __fd;
  _new_fd = this;
  local_18 = ::dup(__fd);
  if (local_18 == -1) {
    this_00 = (system_error *)__cxa_allocate_exception(0x18);
    piVar1 = __errno_location();
    error_code = *piVar1;
    basic_string_view<char>::basic_string_view(&local_28,"cannot duplicate file descriptor {}");
    system_error::system_error<int>(this_00,error_code,local_28,&local_14);
    __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
  }
  file(this,local_18);
  return (int)this;
}

Assistant:

file file::dup(int fd) {
  // Don't retry as dup doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009695399/functions/dup.html
  int new_fd = FMT_POSIX_CALL(dup(fd));
  if (new_fd == -1)
    FMT_THROW(system_error(errno, "cannot duplicate file descriptor {}", fd));
  return file(new_fd);
}